

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printSummaryRow
          (ConsoleReporter *this,string *label,
          vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *cols,size_t row)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  ostream *poVar4;
  size_type in_RCX;
  string *in_RSI;
  long in_RDI;
  string value;
  SummaryColumn col;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *__range1;
  undefined4 in_stack_ffffffffffffff08;
  Code in_stack_ffffffffffffff0c;
  SummaryColumn *in_stack_ffffffffffffff10;
  SummaryColumn *in_stack_ffffffffffffff18;
  SummaryColumn *in_stack_ffffffffffffff20;
  Colour local_a7;
  Colour local_a6;
  Colour local_a5 [13];
  string local_98 [32];
  string local_78 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  SummaryColumn *local_38;
  __normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
  local_30 [2];
  size_type local_20;
  string *local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30[0]._M_current =
       (SummaryColumn *)
       clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::begin
                 ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                  CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  local_38 = (SummaryColumn *)
             clara::std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>::end
                       ((vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_> *)
                        CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
                             *)in_stack_ffffffffffffff10,
                            (__normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)), bVar1
        ) {
    __gnu_cxx::
    __normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
    ::operator*(local_30);
    SummaryColumn::SummaryColumn(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    pvVar2 = clara::std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_50,local_20);
    std::__cxx11::string::string(local_98,(string *)pvVar2);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = std::operator!=(&in_stack_ffffffffffffff10->label,
                              (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
      ;
      if (bVar1) {
        poVar4 = *(ostream **)(in_RDI + 0x18);
        Colour::Colour((Colour *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        poVar4 = Catch::operator<<(poVar4,&local_a6);
        std::operator<<(poVar4," | ");
        Colour::~Colour((Colour *)0x140c2e);
        in_stack_ffffffffffffff20 = *(SummaryColumn **)(in_RDI + 0x18);
        Colour::Colour((Colour *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        poVar4 = Catch::operator<<((ostream *)in_stack_ffffffffffffff20,&local_a7);
        in_stack_ffffffffffffff18 = (SummaryColumn *)std::operator<<(poVar4,local_98);
        in_stack_ffffffffffffff10 =
             (SummaryColumn *)std::operator<<((ostream *)in_stack_ffffffffffffff18,' ');
        std::operator<<((ostream *)in_stack_ffffffffffffff10,local_78);
        Colour::~Colour((Colour *)0x140ca6);
      }
    }
    else {
      poVar4 = std::operator<<(*(ostream **)(in_RDI + 0x18),local_10);
      std::operator<<(poVar4,": ");
      bVar1 = std::operator!=(&in_stack_ffffffffffffff10->label,
                              (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08))
      ;
      if (bVar1) {
        std::operator<<(*(ostream **)(in_RDI + 0x18),local_98);
      }
      else {
        poVar4 = *(ostream **)(in_RDI + 0x18);
        Colour::Colour((Colour *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
        poVar4 = Catch::operator<<(poVar4,local_a5);
        std::operator<<(poVar4,"- none -");
        Colour::~Colour((Colour *)0x140b9d);
      }
    }
    std::__cxx11::string::~string(local_98);
    SummaryColumn::~SummaryColumn(in_stack_ffffffffffffff10);
    __gnu_cxx::
    __normal_iterator<const_Catch::SummaryColumn_*,_std::vector<Catch::SummaryColumn,_std::allocator<Catch::SummaryColumn>_>_>
    ::operator++(local_30);
  }
  std::operator<<(*(ostream **)(in_RDI + 0x18),'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryRow(std::string const& label, std::vector<SummaryColumn> const& cols, std::size_t row) {
    for (auto col : cols) {
        std::string value = col.rows[row];
        if (col.label.empty()) {
            stream << label << ": ";
            if (value != "0")
                stream << value;
            else
                stream << Colour(Colour::Warning) << "- none -";
        } else if (value != "0") {
            stream << Colour(Colour::LightGrey) << " | ";
            stream << Colour(col.colour)
                << value << ' ' << col.label;
        }
    }
    stream << '\n';
}